

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O3

char * __thiscall cpptrace::nested_exception::message(nested_exception *this)

{
  string *this_00;
  long *plVar1;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 auVar4 [12];
  void *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = &this->message_value;
  if ((this->message_value)._M_string_length != 0) goto LAB_001756be;
  local_68 = (this->ptr)._M_exception_object;
  if (local_68 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  auVar4 = std::rethrow_exception((exception_ptr)&local_68);
  if (local_68 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  plVar1 = (long *)__cxa_begin_catch(auVar4._0_8_);
  if (auVar4._8_4_ == 2) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Nested exception: ","");
    __s = (char *)(**(code **)(*plVar1 + 0x10))(plVar1);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_60,__s);
    local_40._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
    paVar3 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == paVar3) {
      local_40.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_40.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    }
    else {
      local_40.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    }
    local_40._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
LAB_00175817:
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    detail::exception_type_name_abi_cxx11_();
    std::operator+(&local_40,"Nested exception holding instance of ",&local_60);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) goto LAB_00175817;
  }
  __cxa_end_catch();
LAB_001756be:
  return (this_00->_M_dataplus)._M_p;
}

Assistant:

const char* nested_exception::message() const noexcept {
        if(message_value.empty()) {
            try {
                std::rethrow_exception(ptr);
            } catch(std::exception& e) {
                message_value = std::string("Nested exception: ") + e.what();
            } catch(...) {
                message_value = "Nested exception holding instance of " + detail::exception_type_name();
            }
        }
        return message_value.c_str();
    }